

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tomjnixon[P]actorpp/submodules/catch2/catch.hpp:9789:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tomjnixon[P]actorpp_submodules_catch2_catch_hpp:9789:35)>
          *this,string *arg)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  Verbosity VVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string lcVerbosity;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_e0);
  VVar4 = Quiet;
  local_58 = 0;
  local_60 = &PTR__BasicResult_00185a00;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  toLower(&local_a0,&local_e0);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
    if (iVar1 == 0) {
      VVar4 = Normal;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_a0);
      if (iVar1 != 0) {
        ::std::operator+(&local_80,"Unrecognised verbosity, \'",&local_e0);
        plVar2 = (long *)::std::__cxx11::string::append((char *)&local_80);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_c0.field_2._M_allocated_capacity = *psVar3;
          local_c0.field_2._8_8_ = plVar2[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar3;
          local_c0._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_c0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                  (__return_storage_ptr__,RuntimeError,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001363d4;
      }
      VVar4 = High;
    }
  }
  ((this->m_lambda).config)->verbosity = VVar4;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00185a00;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_001363d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60 = &PTR__BasicResult_00185a00;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }